

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_WiningStateTest_ReadyHand_TestShell::createTest(TEST_WiningStateTest_ReadyHand_TestShell *this)

{
  TEST_WiningStateTest_ReadyHand_Test *this_00;
  
  this_00 = (TEST_WiningStateTest_ReadyHand_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                         ,0x6c);
  TEST_WiningStateTest_ReadyHand_Test::TEST_WiningStateTest_ReadyHand_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, ReadyHand)
{
	addNoWiningHand();

	h.readyHand();	
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.doubling_factor);
}